

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

void tcu::anon_unknown_75::intToChannel(deUint8 *dst,int src,ChannelType type)

{
  deUint8 dVar1;
  uchar uVar2;
  short sVar3;
  unsigned_short uVar4;
  deFloat16 dVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  ChannelType type_local;
  int src_local;
  deUint8 *dst_local;
  
  switch(type) {
  case SNORM_INT8:
    dVar1 = (anonymous_namespace)::convertSat<signed_char,int>(src);
    *dst = dVar1;
    break;
  case SNORM_INT16:
    sVar3 = (anonymous_namespace)::convertSat<short,int>(src);
    *(short *)dst = sVar3;
    break;
  default:
    break;
  case UNORM_INT8:
    uVar2 = (anonymous_namespace)::convertSat<unsigned_char,int>(src);
    *dst = uVar2;
    break;
  case UNORM_INT16:
    uVar4 = (anonymous_namespace)::convertSat<unsigned_short,int>(src);
    *(unsigned_short *)dst = uVar4;
    break;
  case UNORM_INT24:
    dVar7 = convertSatUint24<int>(src);
    writeUint24(dst,dVar7);
    break;
  case SIGNED_INT8:
    dVar1 = (anonymous_namespace)::convertSat<signed_char,int>(src);
    *dst = dVar1;
    break;
  case SIGNED_INT16:
    sVar3 = (anonymous_namespace)::convertSat<short,int>(src);
    *(short *)dst = sVar3;
    break;
  case SIGNED_INT32:
    iVar6 = (anonymous_namespace)::convertSat<int,int>(src);
    *(int *)dst = iVar6;
    break;
  case UNSIGNED_INT8:
    uVar2 = (anonymous_namespace)::convertSat<unsigned_char,unsigned_int>(src);
    *dst = uVar2;
    break;
  case UNSIGNED_INT16:
    uVar4 = (anonymous_namespace)::convertSat<unsigned_short,unsigned_int>(src);
    *(unsigned_short *)dst = uVar4;
    break;
  case UNSIGNED_INT24:
    dVar7 = convertSatUint24<unsigned_int>(src);
    writeUint24(dst,dVar7);
    break;
  case UNSIGNED_INT32:
    uVar8 = (anonymous_namespace)::convertSat<unsigned_int,unsigned_int>(src);
    *(uint *)dst = uVar8;
    break;
  case HALF_FLOAT:
    dVar5 = deFloat32To16((float)src);
    *(deFloat16 *)dst = dVar5;
    break;
  case FLOAT:
    *(float *)dst = (float)src;
    break;
  case FLOAT64:
    *(double *)dst = (double)src;
  }
  return;
}

Assistant:

void intToChannel (deUint8* dst, int src, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			*((deInt8*)dst)			= convertSat<deInt8>	(src);				break;
		case TextureFormat::SNORM_INT16:		*((deInt16*)dst)		= convertSat<deInt16>	(src);				break;
		case TextureFormat::UNORM_INT8:			*((deUint8*)dst)		= convertSat<deUint8>	(src);				break;
		case TextureFormat::UNORM_INT16:		*((deUint16*)dst)		= convertSat<deUint16>	(src);				break;
		case TextureFormat::UNORM_INT24:		writeUint24(dst,		  convertSatUint24		(src));				break;
		case TextureFormat::SIGNED_INT8:		*((deInt8*)dst)			= convertSat<deInt8>	(src);				break;
		case TextureFormat::SIGNED_INT16:		*((deInt16*)dst)		= convertSat<deInt16>	(src);				break;
		case TextureFormat::SIGNED_INT32:		*((deInt32*)dst)		= convertSat<deInt32>	(src);				break;
		case TextureFormat::UNSIGNED_INT8:		*((deUint8*)dst)		= convertSat<deUint8>	((deUint32)src);	break;
		case TextureFormat::UNSIGNED_INT16:		*((deUint16*)dst)		= convertSat<deUint16>	((deUint32)src);	break;
		case TextureFormat::UNSIGNED_INT24:		writeUint24(dst,		  convertSatUint24		((deUint32)src));	break;
		case TextureFormat::UNSIGNED_INT32:		*((deUint32*)dst)		= convertSat<deUint32>	((deUint32)src);	break;
		case TextureFormat::HALF_FLOAT:			*((deFloat16*)dst)		= deFloat32To16((float)src);				break;
		case TextureFormat::FLOAT:				*((float*)dst)			= (float)src;								break;
		case TextureFormat::FLOAT64:			*((double*)dst)			= (double)src;								break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}